

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_crypt_ecb(mbedtls_aes_context *ctx,int mode,uchar *input,uchar *output)

{
  int iVar1;
  uchar *output_local;
  uchar *input_local;
  int mode_local;
  mbedtls_aes_context *ctx_local;
  
  iVar1 = mbedtls_aesni_has_support(0x2000000);
  if (iVar1 == 0) {
    if (mode == 1) {
      mbedtls_aes_encrypt(ctx,input,output);
    }
    else {
      mbedtls_aes_decrypt(ctx,input,output);
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = mbedtls_aesni_crypt_ecb(ctx,mode,input,output);
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_aes_crypt_ecb( mbedtls_aes_context *ctx,
                    int mode,
                    const unsigned char input[16],
                    unsigned char output[16] )
{
#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_AES ) )
        return( mbedtls_aesni_crypt_ecb( ctx, mode, input, output ) );
#endif

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_HAVE_X86)
    if( aes_padlock_ace )
    {
        if( mbedtls_padlock_xcryptecb( ctx, mode, input, output ) == 0 )
            return( 0 );

        // If padlock data misaligned, we just fall back to
        // unaccelerated mode
        //
    }
#endif

    if( mode == MBEDTLS_AES_ENCRYPT )
        mbedtls_aes_encrypt( ctx, input, output );
    else
        mbedtls_aes_decrypt( ctx, input, output );

    return( 0 );
}